

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_write_channel_id(SSL_HANDSHAKE *hs,CBB *cbb)

{
  bool bVar1;
  int iVar2;
  pointer pkey;
  EC_KEY *key;
  BIGNUM *pBVar3;
  EC_GROUP *group;
  EC_POINT *p;
  BIGNUM *y_00;
  ECDSA_SIG *__p;
  pointer pbVar4;
  pointer peVar5;
  undefined1 local_d0 [8];
  CBB child;
  UniquePtr<ECDSA_SIG> sig;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_88;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  EC_KEY *ec_key;
  size_t digest_len;
  uint8_t digest [64];
  CBB *cbb_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = tls1_channel_id_hash(hs,(uint8_t *)&digest_len,(size_t *)&ec_key);
  if (!bVar1) {
    return false;
  }
  pkey = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&hs->config->channel_id_private)
  ;
  key = EVP_PKEY_get0_EC_KEY(pkey);
  if (key == (EC_KEY *)0x0) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x121e);
    return false;
  }
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&y,(pointer)pBVar3);
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_88,(pointer)pBVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&y);
  if ((bVar1) && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_88), bVar1)) {
    group = EC_KEY_get0_group((EC_KEY *)key);
    p = EC_KEY_get0_public_key((EC_KEY *)key);
    pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&y);
    y_00 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_88);
    iVar2 = EC_POINT_get_affine_coordinates_GFp(group,p,pBVar3,y_00,(BN_CTX *)0x0);
    if (iVar2 != 0) {
      __p = ECDSA_do_sign((uchar *)&digest_len,(int)ec_key,(EC_KEY *)key);
      std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ecdsa_sig_st,bssl::internal::Deleter> *)((long)&child.u + 0x18),
                 (pointer)__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)((long)&child.u + 0x18));
      if (bVar1) {
        iVar2 = CBB_add_u16(cbb,0x7550);
        if ((iVar2 != 0) && (iVar2 = CBB_add_u16_length_prefixed(cbb,(CBB *)local_d0), iVar2 != 0))
        {
          pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&y);
          iVar2 = BN_bn2cbb_padded((CBB *)local_d0,0x20,pbVar4);
          if (iVar2 != 0) {
            pbVar4 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_88);
            iVar2 = BN_bn2cbb_padded((CBB *)local_d0,0x20,pbVar4);
            if (iVar2 != 0) {
              peVar5 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                                  ((long)&child.u + 0x18));
              iVar2 = BN_bn2cbb_padded((CBB *)local_d0,0x20,peVar5->r);
              if (iVar2 != 0) {
                peVar5 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::operator->
                                   ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)
                                    ((long)&child.u + 0x18));
                iVar2 = BN_bn2cbb_padded((CBB *)local_d0,0x20,peVar5->s);
                if ((iVar2 != 0) && (iVar2 = CBB_flush(cbb), iVar2 != 0)) {
                  hs_local._7_1_ = true;
                  goto LAB_0033a497;
                }
              }
            }
          }
        }
        hs_local._7_1_ = false;
      }
      else {
        hs_local._7_1_ = false;
      }
LAB_0033a497:
      std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)((long)&child.u + 0x18));
      goto LAB_0033a4a3;
    }
  }
  hs_local._7_1_ = false;
LAB_0033a4a3:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_88);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&y);
  return hs_local._7_1_;
}

Assistant:

bool tls1_write_channel_id(SSL_HANDSHAKE *hs, CBB *cbb) {
  uint8_t digest[EVP_MAX_MD_SIZE];
  size_t digest_len;
  if (!tls1_channel_id_hash(hs, digest, &digest_len)) {
    return false;
  }

  EC_KEY *ec_key = EVP_PKEY_get0_EC_KEY(hs->config->channel_id_private.get());
  if (ec_key == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  UniquePtr<BIGNUM> x(BN_new()), y(BN_new());
  if (!x || !y ||
      !EC_POINT_get_affine_coordinates_GFp(EC_KEY_get0_group(ec_key),
                                           EC_KEY_get0_public_key(ec_key),
                                           x.get(), y.get(), nullptr)) {
    return false;
  }

  UniquePtr<ECDSA_SIG> sig(ECDSA_do_sign(digest, digest_len, ec_key));
  if (!sig) {
    return false;
  }

  CBB child;
  if (!CBB_add_u16(cbb, TLSEXT_TYPE_channel_id) ||  //
      !CBB_add_u16_length_prefixed(cbb, &child) ||  //
      !BN_bn2cbb_padded(&child, 32, x.get()) ||     //
      !BN_bn2cbb_padded(&child, 32, y.get()) ||     //
      !BN_bn2cbb_padded(&child, 32, sig->r) ||      //
      !BN_bn2cbb_padded(&child, 32, sig->s) ||      //
      !CBB_flush(cbb)) {
    return false;
  }

  return true;
}